

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

call_modifier<trompeloeil::call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>,_GenericOperation2Mock<int,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::trompeloeil_l_tag_type_trompeloeil_62,_trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
 __thiscall
trompeloeil::
call_modifier<trompeloeil::call_matcher<int(float,std::__cxx11::string_const&),std::tuple<float,char_const*>>,GenericOperation2Mock<int,float,std::__cxx11::string_const&>::trompeloeil_l_tag_type_trompeloeil_62,trompeloeil::matcher_info<int(float,std::__cxx11::string_const&)>>
::handle_return<CATCH2_INTERNAL_TEST_25()::__6>
          (call_modifier<trompeloeil::call_matcher<int(float,std::__cxx11::string_const&),std::tuple<float,char_const*>>,GenericOperation2Mock<int,float,std::__cxx11::string_const&>::trompeloeil_l_tag_type_trompeloeil_62,trompeloeil::matcher_info<int(float,std::__cxx11::string_const&)>>
           *this,anon_class_1_0_00000001_for_func *h)

{
  bool valid;
  bool ref_value_mismatch;
  bool matching_ret_type;
  bool ref_const_mismatch;
  bool is_ref_ret;
  bool is_ref_sigret;
  bool ptr_const_mismatch;
  bool is_pointer_ret;
  bool is_pointer_sigret;
  bool void_signature;
  bool is_first_return;
  bool is_illegal_type;
  anon_class_1_0_00000001_for_func *h_local;
  call_modifier<trompeloeil::call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>,_GenericOperation2Mock<int,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::trompeloeil_l_tag_type_trompeloeil_62,_trompeloeil::matcher_info<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *this_local;
  
  call_matcher<int(float,std::__cxx11::string_const&),std::tuple<float,char_const*>>::
  set_return<CATCH2_INTERNAL_TEST_25()::__6>
            (*(call_matcher<int(float,std::__cxx11::string_const&),std::tuple<float,char_const*>> **
              )this,h);
  call_modifier<trompeloeil::call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>,_GenericOperation2Mock<int,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::trompeloeil_l_tag_type_trompeloeil_62,_trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  ::call_modifier((call_modifier<trompeloeil::call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>,_GenericOperation2Mock<int,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::trompeloeil_l_tag_type_trompeloeil_62,_trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                   *)&this_local,
                  *(call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>
                    **)this);
  return (call_modifier<trompeloeil::call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>,_GenericOperation2Mock<int,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::trompeloeil_l_tag_type_trompeloeil_62,_trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
          )(call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>
            *)this_local;
}

Assistant:

call_modifier<Matcher, modifier_tag, return_injector<return_of_t<signature>, Parent >>
    handle_return(
      H&& h)
    {
      using params_type = call_params_type_t<signature>&;
      using sigret = return_of_t<signature>;
      using ret = decltype(std::declval<H>()(std::declval<params_type>()));
      // don't know why MS VS 2015 RC doesn't like std::result_of

      constexpr bool is_illegal_type   = std::is_same<detail::decay_t<ret>, illegal_argument>::value;
      constexpr bool is_first_return   = std::is_same<return_type, void>::value;
      constexpr bool void_signature    = std::is_same<sigret, void>::value;
      constexpr bool is_pointer_sigret = std::is_pointer<sigret>::value;
      constexpr bool is_pointer_ret    = std::is_pointer<detail::decay_t<ret>>::value;
      constexpr bool ptr_const_mismatch =
        is_pointer_ret &&
        is_pointer_sigret &&
        !std::is_const<detail::remove_pointer_t<sigret>>{} &&
        std::is_const<detail::remove_pointer_t<detail::decay_t<ret>>>{};
      constexpr bool is_ref_sigret     = std::is_reference<sigret>::value;
      constexpr bool is_ref_ret        = std::is_reference<ret>::value;
      constexpr bool ref_const_mismatch=
        is_ref_ret &&
        is_ref_sigret &&
        !std::is_const<detail::remove_reference_t<sigret>>::value &&
        std::is_const<detail::remove_reference_t<ret>>::value;
      constexpr bool matching_ret_type = std::is_constructible<sigret, ret>::value;
      constexpr bool ref_value_mismatch = !is_ref_ret && is_ref_sigret;

      static_assert(matching_ret_type || !void_signature,
                    "RETURN does not make sense for void-function");
      static_assert(!is_illegal_type,
                    "RETURN illegal argument");
      static_assert(!ptr_const_mismatch,
                    "RETURN const* from function returning pointer to non-const");
      static_assert(!ref_value_mismatch || matching_ret_type,
                    "RETURN non-reference from function returning reference");
      static_assert(ref_value_mismatch || !ref_const_mismatch,
                    "RETURN const& from function returning non-const reference");

      static_assert(ptr_const_mismatch || ref_const_mismatch || is_illegal_type || matching_ret_type || void_signature,
                    "RETURN value is not convertible to the return type of the function");
      static_assert(is_first_return,
                    "Multiple RETURN does not make sense");
      static_assert(!throws || upper_call_limit == 0,
                    "THROW and RETURN does not make sense");
      static_assert(upper_call_limit > 0,
                    "RETURN for forbidden call does not make sense");

      constexpr bool valid = !is_illegal_type && matching_ret_type && is_first_return && !throws && upper_call_limit > 0;
      using tag = std::integral_constant<bool, valid>;
      matcher->set_return(tag{}, std::forward<H>(h));
      return {matcher};
    }